

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mlkem_test.cc
# Opt level: O3

void __thiscall
anon_unknown.dwarf_83682d::MLKEMTest_Encap1024TestVectors_Test::TestBody
          (MLKEMTest_Encap1024TestVectors_Test *this)

{
  function<void_(FileTest_*)> local_28;
  
  local_28.super__Function_base._M_functor._8_8_ = 0;
  local_28.super__Function_base._M_functor._M_unused._M_object =
       MLKEMEncapFileTest<MLKEM1024_public_key,_1568UL,_&MLKEM1024_parse_public_key,_1568UL,_&(anonymous_namespace)::wrapper_1024_encap_external_entropy>
  ;
  local_28._M_invoker = std::_Function_handler<void_(FileTest_*),_void_(*)(FileTest_*)>::_M_invoke;
  local_28.super__Function_base._M_manager =
       std::_Function_handler<void_(FileTest_*),_void_(*)(FileTest_*)>::_M_manager;
  FileTestGTest("crypto/mlkem/mlkem1024_encap_tests.txt",&local_28);
  if (local_28.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_28.super__Function_base._M_manager)
              ((_Any_data *)&local_28,(_Any_data *)&local_28,__destroy_functor);
  }
  return;
}

Assistant:

TEST(MLKEMTest, Encap1024TestVectors) {
  FileTestGTest(
      "crypto/mlkem/mlkem1024_encap_tests.txt",
      MLKEMEncapFileTest<MLKEM1024_public_key, MLKEM1024_PUBLIC_KEY_BYTES,
                         MLKEM1024_parse_public_key, MLKEM1024_CIPHERTEXT_BYTES,
                         wrapper_1024_encap_external_entropy>);
}